

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathCmpNodes(xmlNodePtr node1,xmlNodePtr node2)

{
  xmlElementType xVar1;
  xmlElementType xVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  _xmlNode *p_Var5;
  int iVar6;
  _xmlNode *p_Var7;
  xmlNodePtr pxVar8;
  int iVar9;
  xmlNodePtr pxVar10;
  int iVar11;
  xmlNodePtr pxVar12;
  
  if (node2 == (xmlNodePtr)0x0 || node1 == (xmlNodePtr)0x0) {
    return -2;
  }
  if (node1 == node2) {
    return 0;
  }
  xVar1 = node1->type;
  if (xVar1 != XML_ATTRIBUTE_NODE) {
    pxVar10 = (_xmlNode *)0x0;
    pxVar8 = node1;
  }
  else {
    pxVar8 = node1->parent;
    pxVar10 = node1;
  }
  xVar2 = node2->type;
  if (xVar2 != XML_ATTRIBUTE_NODE) {
    p_Var7 = (xmlNodePtr)0x0;
  }
  else {
    p_Var7 = node2;
    node2 = node2->parent;
  }
  if (pxVar8 == node2) {
    if ((xVar1 == XML_ATTRIBUTE_NODE) != (xVar2 == XML_ATTRIBUTE_NODE)) {
      return (uint)(xVar2 == XML_ATTRIBUTE_NODE) * 2 + -1;
    }
    if (xVar1 != XML_ATTRIBUTE_NODE) {
      return 0;
    }
    do {
      p_Var7 = p_Var7->prev;
      if (p_Var7 == (_xmlNode *)0x0) {
        return -1;
      }
    } while (p_Var7 != pxVar10);
  }
  else if (((pxVar8->type != XML_NAMESPACE_DECL) && (node2->type != XML_NAMESPACE_DECL)) &&
          (pxVar8 != node2->prev)) {
    if (pxVar8 == node2->next) {
      return -1;
    }
    if (((pxVar8->type == XML_ELEMENT_NODE) && (node2->type == XML_ELEMENT_NODE)) &&
       ((pxVar3 = pxVar8->content, (long)pxVar3 < 0 &&
        ((pxVar4 = node2->content, (long)pxVar4 < 0 && (pxVar8->doc == node2->doc)))))) {
      if ((long)pxVar4 < (long)pxVar3) {
        return 1;
      }
      if ((long)pxVar3 < (long)pxVar4) {
        return -1;
      }
    }
    iVar9 = 0;
    pxVar10 = node2;
    while (pxVar12 = pxVar10->parent, pxVar12 != (xmlNodePtr)0x0) {
      if (pxVar12 == pxVar8) {
        return 1;
      }
      iVar9 = iVar9 + 1;
      pxVar10 = pxVar12;
    }
    iVar11 = 0;
    pxVar12 = pxVar8;
    while (p_Var7 = pxVar12->parent, p_Var7 != (_xmlNode *)0x0) {
      if (p_Var7 == node2) {
        return -1;
      }
      iVar11 = iVar11 + 1;
      pxVar12 = p_Var7;
    }
    iVar6 = iVar11;
    if (pxVar10 != pxVar12) {
      return -2;
    }
    for (; iVar9 < iVar6; iVar6 = iVar6 + -1) {
      pxVar8 = pxVar8->parent;
    }
    if (iVar9 < iVar11) {
      iVar11 = iVar9;
    }
    for (; iVar11 < iVar9; iVar9 = iVar9 + -1) {
      node2 = node2->parent;
    }
    while( true ) {
      p_Var7 = pxVar8->parent;
      p_Var5 = node2->parent;
      if (p_Var7 == p_Var5) break;
      if (p_Var7 == (_xmlNode *)0x0) {
        return -2;
      }
      node2 = p_Var5;
      pxVar8 = p_Var7;
      if (p_Var5 == (_xmlNode *)0x0) {
        return -2;
      }
    }
    if (pxVar8 != node2->prev) {
      if (pxVar8 == node2->next) {
        return -1;
      }
      if ((((pxVar8->type == XML_ELEMENT_NODE) && (node2->type == XML_ELEMENT_NODE)) &&
          (pxVar3 = pxVar8->content, (long)pxVar3 < 0)) &&
         ((pxVar4 = node2->content, (long)pxVar4 < 0 && (pxVar8->doc == node2->doc)))) {
        if ((long)pxVar4 < (long)pxVar3) {
          return 1;
        }
        if ((long)pxVar3 < (long)pxVar4) {
          return -1;
        }
      }
      do {
        pxVar8 = pxVar8->next;
        if (pxVar8 == (xmlNodePtr)0x0) {
          return -1;
        }
      } while (pxVar8 != node2);
    }
  }
  return 1;
}

Assistant:

int
xmlXPathCmpNodes(xmlNodePtr node1, xmlNodePtr node2) {
    int depth1, depth2;
    int attr1 = 0, attr2 = 0;
    xmlNodePtr attrNode1 = NULL, attrNode2 = NULL;
    xmlNodePtr cur, root;

    if ((node1 == NULL) || (node2 == NULL))
	return(-2);
    /*
     * a couple of optimizations which will avoid computations in most cases
     */
    if (node1 == node2)		/* trivial case */
	return(0);
    if (node1->type == XML_ATTRIBUTE_NODE) {
	attr1 = 1;
	attrNode1 = node1;
	node1 = node1->parent;
    }
    if (node2->type == XML_ATTRIBUTE_NODE) {
	attr2 = 1;
	attrNode2 = node2;
	node2 = node2->parent;
    }
    if (node1 == node2) {
	if (attr1 == attr2) {
	    /* not required, but we keep attributes in order */
	    if (attr1 != 0) {
	        cur = attrNode2->prev;
		while (cur != NULL) {
		    if (cur == attrNode1)
		        return (1);
		    cur = cur->prev;
		}
		return (-1);
	    }
	    return(0);
	}
	if (attr2 == 1)
	    return(1);
	return(-1);
    }
    if ((node1->type == XML_NAMESPACE_DECL) ||
        (node2->type == XML_NAMESPACE_DECL))
	return(1);
    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);

    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > XML_NODE_SORT_VALUE(node1)) &&
	(0 > XML_NODE_SORT_VALUE(node2)) &&
	(node1->doc == node2->doc)) {
	XML_INTPTR_T l1, l2;

	l1 = -XML_NODE_SORT_VALUE(node1);
	l2 = -XML_NODE_SORT_VALUE(node2);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

    /*
     * compute depth to root
     */
    for (depth2 = 0, cur = node2;cur->parent != NULL;cur = cur->parent) {
	if (cur->parent == node1)
	    return(1);
	depth2++;
    }
    root = cur;
    for (depth1 = 0, cur = node1;cur->parent != NULL;cur = cur->parent) {
	if (cur->parent == node2)
	    return(-1);
	depth1++;
    }
    /*
     * Distinct document (or distinct entities :-( ) case.
     */
    if (root != cur) {
	return(-2);
    }
    /*
     * get the nearest common ancestor.
     */
    while (depth1 > depth2) {
	depth1--;
	node1 = node1->parent;
    }
    while (depth2 > depth1) {
	depth2--;
	node2 = node2->parent;
    }
    while (node1->parent != node2->parent) {
	node1 = node1->parent;
	node2 = node2->parent;
	/* should not happen but just in case ... */
	if ((node1 == NULL) || (node2 == NULL))
	    return(-2);
    }
    /*
     * Find who's first.
     */
    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);
    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > XML_NODE_SORT_VALUE(node1)) &&
	(0 > XML_NODE_SORT_VALUE(node2)) &&
	(node1->doc == node2->doc)) {
	XML_INTPTR_T l1, l2;

	l1 = -XML_NODE_SORT_VALUE(node1);
	l2 = -XML_NODE_SORT_VALUE(node2);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

    for (cur = node1->next;cur != NULL;cur = cur->next)
	if (cur == node2)
	    return(1);
    return(-1); /* assume there is no sibling list corruption */
}